

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

uint64_t getBits(uint32_t nBits,uint64_t *c,uint32_t *lc,uint8_t **inptr)

{
  uint8_t *in;
  uint8_t **inptr_local;
  uint32_t *lc_local;
  uint64_t *c_local;
  uint32_t nBits_local;
  
  in = *inptr;
  while (*lc < nBits) {
    *c = *c << 8 | (ulong)*in;
    *lc = *lc + 8;
    in = in + 1;
  }
  *inptr = in;
  *lc = *lc - nBits;
  return *c >> ((byte)*lc & 0x3f) & (long)((1 << ((byte)nBits & 0x1f)) + -1);
}

Assistant:

static inline uint64_t
getBits (uint32_t nBits, uint64_t* c, uint32_t* lc, const uint8_t** inptr)
{
    const uint8_t* in = *inptr;
    while (*lc < nBits)
    {
        *c = (*c << 8) | (uint64_t) (*in++);
        *lc += 8;
    }

    *inptr = in;
    *lc -= nBits;
    return (*c >> *lc) & ((1 << nBits) - 1);
}